

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-logger-winit.cpp
# Opt level: O2

void __thiscall
debug_logger_wrong_initialization::test_method(debug_logger_wrong_initialization *this)

{
  string *psVar1;
  long lVar2;
  CustomEntity *this_00;
  int iVar3;
  bool bVar4;
  allocator<char> local_92;
  allocator<char> local_91;
  undefined **local_90;
  undefined1 local_88;
  undefined8 *local_80;
  char *local_78;
  string local_70 [32];
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  dynamicgraph::RealTimeLogger::instance();
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x46);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_00109c80;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
  ;
  local_48 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (&local_90,&local_50,0x46,1,2,dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_,
             "dynamicgraph::CustomEntity::CLASS_NAME","CustomEntity","\"CustomEntity\"");
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"CustomEntity",&local_91);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"my-entity-2",&local_92);
  lVar2 = dynamicgraph::FactoryStorage::newEntity(psVar1,(string *)&local_90);
  if (lVar2 == 0) {
    this_00 = (CustomEntity *)0x0;
  }
  else {
    this_00 = (CustomEntity *)
              __dynamic_cast(lVar2,&dynamicgraph::Entity::typeinfo,
                             &dynamicgraph::CustomEntity::typeinfo,0);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_90);
  iVar3 = 1000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    dynamicgraph::CustomEntity::testDebugTrace(this_00);
  }
  dynamicgraph::RealTimeLogger::destroy();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(debug_logger_wrong_initialization) {
  dynamicgraph::RealTimeLogger::instance();

  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity &entity =
      *(dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity(
              "CustomEntity", "my-entity-2")));

  for (unsigned int i = 0; i < 1000; i++) {
    entity.testDebugTrace();
  }

  dynamicgraph::RealTimeLogger::destroy();
}